

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O2

void __thiscall
QTextOdfWriter::writeFormats(QTextOdfWriter *this,QXmlStreamWriter *writer,QSet<int> *formats)

{
  int iVar1;
  char16_t *pcVar2;
  Span *pSVar3;
  bool bVar4;
  int iVar5;
  storage_type *psVar6;
  ulong uVar7;
  QTextFormat *this_00;
  QArrayDataPointer<QTextFormat> *pQVar8;
  QList<QTextFormat> *in_R9;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QTextBlockFormat format;
  QTextListFormat format_00;
  QTextTableCellFormat format_01;
  QTextTableFormat format_02;
  QTextCharFormat format_03;
  QTextFrameFormat format_04;
  QSet<int> *__range1;
  piter local_d8;
  QArrayDataPointer<QTextFormat> local_c8;
  QTextFormat local_a8;
  QTextFormat local_98;
  QTextFormat local_88;
  QTextFormat local_78;
  QTextFormat local_68;
  QTextFormat local_58;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = (this->officeNS).d.ptr;
  uVar7 = (this->officeNS).d.size;
  psVar6 = (storage_type *)QByteArrayView::lengthHelperCharArray("automatic-styles",0x11);
  QVar9.m_data = psVar6;
  QVar9.m_size = (qsizetype)&local_c8;
  QString::fromLatin1(QVar9);
  QVar10.m_size = (size_t)pcVar2;
  QVar10.field_0.m_data_utf8 = (char *)writer;
  QVar11.m_size = (size_t)local_c8.ptr;
  QVar11.field_0.m_data = (void *)(uVar7 | 0x8000000000000000);
  QXmlStreamWriter::writeStartElement(QVar10,QVar11);
  pQVar8 = (QArrayDataPointer<QTextFormat> *)local_c8.size;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
  local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.ptr = (QTextFormat *)&DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::allFormats((QList<QTextFormat> *)&local_c8,this->m_document);
  local_d8 = (piter)QHash<int,_QHashDummyValue>::begin(&formats->q_hash);
  do {
    if (local_d8.d == (Data<QHashPrivate::Node<int,_QHashDummyValue>_> *)0x0 && local_d8.bucket == 0
       ) {
      QXmlStreamWriter::writeEndElement();
      QArrayDataPointer<QTextFormat>::~QArrayDataPointer(&local_c8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    pSVar3 = (local_d8.d)->spans;
    uVar7 = local_d8.bucket >> 7;
    iVar1 = *(int *)pSVar3[uVar7].entries[pSVar3[uVar7].offsets[(uint)local_d8.bucket & 0x7f]].
                    storage.data;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextFormat::QTextFormat((QTextFormat *)local_48,local_c8.ptr + iVar1);
    iVar5 = QTextFormat::type((QTextFormat *)local_48);
    switch(iVar5) {
    case 1:
      this_00 = &local_78;
      QTextFormat::toBlockFormat(this_00);
      format.super_QTextFormat.format_type = iVar1;
      format.super_QTextFormat.d.d.ptr =
           (totally_ordered_wrapper<QTextFormatPrivate_*>)
           (totally_ordered_wrapper<QTextFormatPrivate_*>)this_00;
      format.super_QTextFormat._12_4_ = 0;
      writeBlockFormat(this,writer,format,(int)pQVar8);
      break;
    case 2:
      bVar4 = QTextFormat::isTableCellFormat((QTextFormat *)local_48);
      if (bVar4) {
        this_00 = &local_58;
        QTextFormat::toTableCellFormat(this_00);
        pQVar8 = &local_c8;
        format_01.super_QTextCharFormat.super_QTextFormat.format_type = iVar1;
        format_01.super_QTextCharFormat.super_QTextFormat.d.d.ptr =
             (totally_ordered_wrapper<QTextFormatPrivate_*>)
             (totally_ordered_wrapper<QTextFormatPrivate_*>)this_00;
        format_01.super_QTextCharFormat.super_QTextFormat._12_4_ = 0;
        writeTableCellFormat(this,writer,format_01,(int)pQVar8,in_R9);
      }
      else {
        this_00 = &local_68;
        QTextFormat::toCharFormat(this_00);
        format_03.super_QTextFormat.format_type = iVar1;
        format_03.super_QTextFormat.d.d.ptr =
             (totally_ordered_wrapper<QTextFormatPrivate_*>)
             (totally_ordered_wrapper<QTextFormatPrivate_*>)this_00;
        format_03.super_QTextFormat._12_4_ = 0;
        writeCharacterFormat(this,writer,format_03,(int)pQVar8);
      }
      break;
    case 3:
      this_00 = &local_88;
      QTextFormat::toListFormat(this_00);
      format_00.super_QTextFormat.format_type = iVar1;
      format_00.super_QTextFormat.d.d.ptr =
           (totally_ordered_wrapper<QTextFormatPrivate_*>)
           (totally_ordered_wrapper<QTextFormatPrivate_*>)this_00;
      format_00.super_QTextFormat._12_4_ = 0;
      writeListFormat(this,writer,format_00,(int)pQVar8);
      break;
    default:
      goto switchD_005224de_caseD_4;
    case 5:
      bVar4 = QTextFormat::isTableFormat((QTextFormat *)local_48);
      if (bVar4) {
        this_00 = &local_98;
        QTextFormat::toTableFormat(this_00);
        format_02.super_QTextFrameFormat.super_QTextFormat.format_type = iVar1;
        format_02.super_QTextFrameFormat.super_QTextFormat.d.d.ptr =
             (totally_ordered_wrapper<QTextFormatPrivate_*>)
             (totally_ordered_wrapper<QTextFormatPrivate_*>)this_00;
        format_02.super_QTextFrameFormat.super_QTextFormat._12_4_ = 0;
        writeTableFormat(this,writer,format_02,(int)pQVar8);
      }
      else {
        this_00 = &local_a8;
        QTextFormat::toFrameFormat(this_00);
        format_04.super_QTextFormat.format_type = iVar1;
        format_04.super_QTextFormat.d.d.ptr =
             (totally_ordered_wrapper<QTextFormatPrivate_*>)
             (totally_ordered_wrapper<QTextFormatPrivate_*>)this_00;
        format_04.super_QTextFormat._12_4_ = 0;
        writeFrameFormat(this,writer,format_04,(int)pQVar8);
      }
    }
    QTextFormat::~QTextFormat(this_00);
switchD_005224de_caseD_4:
    QTextFormat::~QTextFormat((QTextFormat *)local_48);
    QHashPrivate::iterator<QHashPrivate::Node<int,_QHashDummyValue>_>::operator++(&local_d8);
  } while( true );
}

Assistant:

void QTextOdfWriter::writeFormats(QXmlStreamWriter &writer, const QSet<int> &formats) const
{
    writer.writeStartElement(officeNS, QString::fromLatin1("automatic-styles"));
    QList<QTextFormat> allStyles = m_document->allFormats();
    for (int formatIndex : formats) {
        QTextFormat textFormat = allStyles.at(formatIndex);
        switch (textFormat.type()) {
        case QTextFormat::CharFormat:
            if (textFormat.isTableCellFormat())
                writeTableCellFormat(writer, textFormat.toTableCellFormat(), formatIndex, allStyles);
            else
                writeCharacterFormat(writer, textFormat.toCharFormat(), formatIndex);
            break;
        case QTextFormat::BlockFormat:
            writeBlockFormat(writer, textFormat.toBlockFormat(), formatIndex);
            break;
        case QTextFormat::ListFormat:
            writeListFormat(writer, textFormat.toListFormat(), formatIndex);
            break;
        case QTextFormat::FrameFormat:
            if (textFormat.isTableFormat())
                writeTableFormat(writer, textFormat.toTableFormat(), formatIndex);
            else
                writeFrameFormat(writer, textFormat.toFrameFormat(), formatIndex);
            break;
        }
    }

    writer.writeEndElement(); // automatic-styles
}